

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-dgram-too-big.c
# Opt level: O3

int run_test_udp_dgram_too_big(void)

{
  int iVar1;
  int extraout_EAX;
  uv_udp_send_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  sockaddr_in addr;
  char dgram [65536];
  undefined1 auStack_10028 [16];
  undefined1 auStack_10018 [16];
  undefined1 auStack_10008 [65536];
  
  memset(auStack_10008,0x2a,0x10000);
  puVar2 = (uv_udp_send_t *)uv_default_loop();
  iVar4 = 0x54e740;
  iVar1 = uv_udp_init();
  if (iVar1 == 0) {
    auStack_10028 = uv_buf_init(auStack_10008,0x10000);
    puVar2 = (uv_udp_send_t *)0x1a4e6a;
    iVar4 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_10018);
    if (iVar1 != 0) goto LAB_00187901;
    puVar2 = &req_;
    iVar4 = 0x54e740;
    iVar1 = uv_udp_send(&req_,&handle_,auStack_10028,1,auStack_10018,send_cb);
    if (iVar1 != 0) goto LAB_00187906;
    if (close_cb_called != 0) goto LAB_0018790b;
    if (send_cb_called != 0) goto LAB_00187910;
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    iVar4 = 0;
    uv_run();
    if (send_cb_called != 1) goto LAB_00187915;
    if (close_cb_called != 1) goto LAB_0018791a;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar4 = 0;
    uv_run(uVar3);
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_dgram_too_big_cold_1();
LAB_00187901:
    run_test_udp_dgram_too_big_cold_2();
LAB_00187906:
    run_test_udp_dgram_too_big_cold_3();
LAB_0018790b:
    run_test_udp_dgram_too_big_cold_4();
LAB_00187910:
    run_test_udp_dgram_too_big_cold_5();
LAB_00187915:
    run_test_udp_dgram_too_big_cold_6();
LAB_0018791a:
    run_test_udp_dgram_too_big_cold_7();
  }
  run_test_udp_dgram_too_big_cold_8();
  if (puVar2 == &req_) {
    if (req_.handle == &handle_) {
      if (iVar4 == -0x5a) {
        uv_close(&handle_,close_cb);
        send_cb_called = send_cb_called + 1;
        return extraout_EAX;
      }
      goto LAB_0018796b;
    }
  }
  else {
    send_cb_cold_1();
  }
  send_cb_cold_2();
LAB_0018796b:
  send_cb_cold_3();
  if (puVar2 == (uv_udp_send_t *)&handle_) {
    close_cb_called = close_cb_called + 1;
    return 0x54e740;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_dgram_too_big) {
  char dgram[65536]; /* 64K MTU is unlikely, even on localhost */
  struct sockaddr_in addr;
  uv_buf_t buf;
  int r;

  memset(dgram, 42, sizeof dgram); /* silence valgrind */

  r = uv_udp_init(uv_default_loop(), &handle_);
  ASSERT(r == 0);

  buf = uv_buf_init(dgram, sizeof dgram);
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_send(&req_,
                  &handle_,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}